

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

nn_list_item * nn_list_erase(nn_list *self,nn_list_item *item)

{
  nn_list *pnVar1;
  nn_list *pnVar2;
  
  pnVar2 = (nn_list *)item->prev;
  pnVar1 = self;
  if ((pnVar2 != (nn_list *)0x0) && (pnVar1 = pnVar2, pnVar2 == (nn_list *)0xffffffffffffffff)) {
    pnVar1 = self;
    nn_list_erase_cold_1();
    self = pnVar1;
  }
  pnVar1->first = item->next;
  pnVar1 = (nn_list *)item->next;
  if (pnVar1 != (nn_list *)0x0) {
    self = pnVar1;
  }
  self->last = (nn_list_item *)pnVar2;
  *(undefined4 *)&item->next = 0xffffffff;
  *(undefined4 *)((long)&item->next + 4) = 0xffffffff;
  *(undefined4 *)&item->prev = 0xffffffff;
  *(undefined4 *)((long)&item->prev + 4) = 0xffffffff;
  return (nn_list_item *)pnVar1;
}

Assistant:

struct nn_list_item *nn_list_erase (struct nn_list *self,
    struct nn_list_item *item)
{
    struct nn_list_item *next;

    nn_assert (nn_list_item_isinlist (item));

    if (item->prev)
        item->prev->next = item->next;
    else
        self->first = item->next;
    if (item->next)
        item->next->prev = item->prev;
    else
        self->last = item->prev;

    next = item->next;

    item->prev = NN_LIST_NOTINLIST;
    item->next = NN_LIST_NOTINLIST;

    return next;
}